

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall fineftp::FtpSession::handleFtpCommandOPTS(FtpSession *this,string *param)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  string param_upper;
  allocator local_61;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,(string *)param);
  for (sVar3 = 0; local_40._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    iVar2 = toupper((uint)(byte)local_40._M_dataplus._M_p[sVar3]);
    local_40._M_dataplus._M_p[sVar3] = (char)iVar2;
  }
  bVar1 = ::std::operator==(&local_40,"UTF8 ON");
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&local_60,"OK",&local_61);
    sendFtpMessage(this,COMMAND_OK,&local_60);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_60,"Unrecognized parameter",&local_61);
    sendFtpMessage(this,COMMAND_NOT_IMPLEMENTED_FOR_PARAMETER,&local_60);
  }
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void FtpSession::handleFtpCommandOPTS(const std::string& param)
  {
    std::string param_upper = param;
    std::transform(param_upper.begin(), param_upper.end(), param_upper.begin(), [](char c) { return static_cast<char>(std::toupper(static_cast<unsigned char>(c))); });

    if (param_upper == "UTF8 ON")
    {
      sendFtpMessage(FtpReplyCode::COMMAND_OK, "OK");
      return;
    }

    sendFtpMessage(FtpReplyCode::COMMAND_NOT_IMPLEMENTED_FOR_PARAMETER, "Unrecognized parameter");
  }